

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusLightModel::emulate_mthd(MthdCelsiusLightModel *this)

{
  MthdCelsiusLightModel *this_local;
  
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a &
         0xfffbffff |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3d) >> 0x3f) << 0x12);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a &
         0xfff7ffff | ((this->super_SingleMthdTest).super_MthdTest.val & 1) << 0x13;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a &
         0xffefffff |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3e) >> 0x3f) << 0x14);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
         0xefffffff |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2f) >> 0x3f) << 0x1c);
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d
                   << 0x23)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			insrt(exp.celsius_xf_misc_a, 18, 1, extr(val, 2, 1));
			insrt(exp.celsius_xf_misc_a, 19, 1, extr(val, 0, 1));
			insrt(exp.celsius_xf_misc_a, 20, 1, extr(val, 1, 1));
			insrt(exp.celsius_xf_misc_b, 28, 1, extr(val, 16, 1));
			if (!extr(exp.debug_d, 28, 1)) {
				exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
				exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
			}
		}
	}